

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<unsigned_short>,unsigned_short,duckdb::MinOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  ushort uVar1;
  unsigned_long *puVar2;
  ushort *puVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      puVar3 = *(ushort **)states->data;
      uVar1 = *(ushort *)input->data;
      if ((char)puVar3[1] == '\0') {
        *puVar3 = uVar1;
        *(undefined1 *)(puVar3 + 1) = 1;
      }
      else if (uVar1 < *puVar3) {
        *puVar3 = uVar1;
      }
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    pdVar5 = states->data;
    FlatVector::VerifyFlatVector(input);
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar9 = 0;
        do {
          puVar3 = *(ushort **)(pdVar5 + iVar9 * 8);
          uVar1 = *(ushort *)(pdVar4 + iVar9 * 2);
          if ((char)puVar3[1] == '\0') {
            *puVar3 = uVar1;
            *(undefined1 *)(puVar3 + 1) = 1;
          }
          else if (uVar1 < *puVar3) {
            *puVar3 = uVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        uVar6 = puVar2[uVar10];
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar12 = uVar13;
        if (uVar6 != 0) {
          uVar12 = uVar11;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              do {
                puVar3 = *(ushort **)(pdVar5 + uVar12 * 8);
                uVar1 = *(ushort *)(pdVar4 + uVar12 * 2);
                if ((char)puVar3[1] == '\0') {
                  *puVar3 = uVar1;
                  *(undefined1 *)(puVar3 + 1) = 1;
                }
                else if (uVar1 < *puVar3) {
                  *puVar3 = uVar1;
                }
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
          }
          else if (uVar11 < uVar13) {
            uVar12 = 0;
            do {
              if ((uVar6 >> (uVar12 & 0x3f) & 1) != 0) {
                puVar3 = *(ushort **)(pdVar5 + uVar12 * 8 + uVar11 * 8);
                uVar1 = *(ushort *)(pdVar4 + uVar12 * 2 + uVar11 * 2);
                if ((char)puVar3[1] == '\0') {
                  *puVar3 = uVar1;
                  *(undefined1 *)(puVar3 + 1) = 1;
                }
                else if (uVar1 < *puVar3) {
                  *puVar3 = uVar1;
                }
              }
              uVar12 = uVar12 + 1;
            } while ((uVar11 - uVar13) + uVar12 != 0);
            uVar12 = uVar11 + uVar12;
          }
        }
        uVar10 = uVar10 + 1;
        uVar11 = uVar12;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_b8);
    Vector::ToUnifiedFormat(states,count,&local_70);
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar7 = (local_b8.sel)->sel_vector;
        psVar8 = (local_70.sel)->sel_vector;
        iVar9 = 0;
        do {
          iVar14 = iVar9;
          if (psVar7 != (sel_t *)0x0) {
            iVar14 = (idx_t)psVar7[iVar9];
          }
          iVar15 = iVar9;
          if (psVar8 != (sel_t *)0x0) {
            iVar15 = (idx_t)psVar8[iVar9];
          }
          puVar3 = *(ushort **)(local_70.data + iVar15 * 8);
          uVar1 = *(ushort *)(local_b8.data + iVar14 * 2);
          if ((char)puVar3[1] == '\0') {
            *puVar3 = uVar1;
            *(undefined1 *)(puVar3 + 1) = 1;
          }
          else if (uVar1 < *puVar3) {
            *puVar3 = uVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar7 = (local_b8.sel)->sel_vector;
      psVar8 = (local_70.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar14 = iVar9;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar9];
        }
        iVar15 = iVar9;
        if (psVar8 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar8[iVar9];
        }
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
             >> (iVar14 & 0x3f) & 1) != 0) {
          puVar3 = *(ushort **)(local_70.data + iVar15 * 8);
          uVar1 = *(ushort *)(local_b8.data + iVar14 * 2);
          if ((char)puVar3[1] == '\0') {
            *puVar3 = uVar1;
            *(undefined1 *)(puVar3 + 1) = 1;
          }
          else if (uVar1 < *puVar3) {
            *puVar3 = uVar1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}